

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

TestCase * __thiscall Catch::TestCase::withName(TestCase *this,string *_newName)

{
  string *in_RDX;
  TestCase *in_RDI;
  TestCase *other;
  TestCase *in_stack_ffffffffffffffb8;
  TestCase *pTVar1;
  
  pTVar1 = in_RDI;
  TestCase(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::string::operator=((string *)in_RDI,in_RDX);
  return pTVar1;
}

Assistant:

TestCase TestCase::withName( std::string const& _newName ) const {
        TestCase other( *this );
        other.name = _newName;
        return other;
    }